

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void push_sorted_suite::push_increasing(void)

{
  array<int,_4UL> *paVar1;
  int *piVar2;
  int local_58;
  undefined8 local_54;
  undefined4 local_4c;
  array<int,_4UL> expect;
  int local_38 [2];
  
  local_4c = 0;
  local_54 = 0;
  local_58 = 0xb;
  vista::push_sorted<false,int*,std::less<int&>>(&local_58);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  paVar1 = &expect;
  piVar2 = local_38;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x442,"void push_sorted_suite::push_increasing()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  local_54 = CONCAT44(local_54._4_4_,0x16);
  vista::push_sorted<false,int*,std::less<int&>>(&local_58,(long)&local_54 + 4,piVar2,paVar1);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  paVar1 = &expect;
  piVar2 = local_38;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x449,"void push_sorted_suite::push_increasing()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  local_54 = CONCAT44(0x21,(undefined4)local_54);
  vista::push_sorted<false,int*,std::less<int&>>(&local_58,&local_4c,piVar2,paVar1);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x450,"void push_sorted_suite::push_increasing()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  local_4c = 0x2c;
  vista::push_sorted<false,int*,std::less<int&>>(&local_58,&expect);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x457,"void push_sorted_suite::push_increasing()",&local_58,expect._M_elems,
             expect._M_elems,local_38);
  return;
}

Assistant:

void push_increasing()
{
    std::array<int, 4> storage = { 0, 0, 0, 0 };
    auto last = storage.begin();
    *last++ = 11;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 22;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 0, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 33;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 0 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    *last++ = 44;
    push_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}